

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::operator*=(CImg<unsigned_char> *this,uchar value)

{
  bool bVar1;
  uchar *puVar2;
  uchar *puVar3;
  
  bVar1 = is_empty(this);
  if (!bVar1) {
    puVar2 = this->_data;
    puVar3 = puVar2 + (ulong)this->_spectrum * (ulong)this->_depth *
                      (ulong)this->_height * (ulong)this->_width;
    while (puVar3 = puVar3 + -1, puVar2 <= puVar3) {
      *puVar3 = *puVar3 * value;
      puVar2 = this->_data;
    }
  }
  return this;
}

Assistant:

CImg<T>& operator*=(const t value) {
      if (is_empty()) return *this;
#ifdef cimg_use_openmp
#pragma omp parallel for if (size()>=262144)
#endif
      cimg_rof(*this,ptrd,T) *ptrd = (T)(*ptrd * value);
      return *this;
    }